

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_test.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_317c8b::ConvolveTestBase::SetUp(ConvolveTestBase *this)

{
  int iVar1;
  ConvolveFunctions *pCVar2;
  bool bVar3;
  uint8_t uVar4;
  undefined2 uVar5;
  uint16_t uVar6;
  ushort uVar7;
  ParamType *pPVar8;
  uint uVar9;
  int in_ESI;
  int i;
  ulong uVar10;
  int i_1;
  ACMRandom prng;
  
  pPVar8 = testing::
           WithParamInterface<std::tuple<int,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>_>
           ::GetParam();
  pCVar2 = (pPVar8->
           super__Tuple_impl<0UL,_int,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>).
           super__Tuple_impl<1UL,_int,_const_(anonymous_namespace)::ConvolveFunctions_*>.
           super__Tuple_impl<2UL,_const_(anonymous_namespace)::ConvolveFunctions_*>.
           super__Head_base<2UL,_const_(anonymous_namespace)::ConvolveFunctions_*,_false>.
           _M_head_impl;
  this->UUT_ = pCVar2;
  iVar1 = pCVar2->use_highbd_;
  uVar9 = 0xff;
  if (iVar1 != 0) {
    uVar9 = ~(-1 << ((byte)iVar1 & 0x1f));
  }
  this->mask_ = uVar9;
  for (uVar10 = 0; uVar10 != 0x40000; uVar10 = uVar10 + 1) {
    bVar3 = IsIndexInBorder((ConvolveTestBase *)(uVar10 & 0xffffffff),in_ESI);
    if (bVar3) {
      *(undefined1 *)((anonymous_namespace)::ConvolveTestBase::output_ + uVar10) = 0xff;
      uVar5 = (undefined2)this->mask_;
    }
    else {
      *(undefined1 *)((anonymous_namespace)::ConvolveTestBase::output_ + uVar10) = 0;
      uVar5 = 0;
    }
    *(undefined2 *)((anonymous_namespace)::ConvolveTestBase::output16_ + uVar10 * 2) = uVar5;
  }
  prng.random_.state_ = (Random)0xbaba;
  for (uVar10 = 0; uVar10 != 0x40000; uVar10 = uVar10 + 1) {
    if ((uVar10 & 1) == 0) {
      uVar4 = libaom_test::ACMRandom::Rand8Extremes(&prng);
      *(uint8_t *)((anonymous_namespace)::ConvolveTestBase::input_ + uVar10) = uVar4;
      uVar6 = libaom_test::ACMRandom::Rand16(&prng);
      uVar7 = uVar6 & (ushort)this->mask_;
    }
    else {
      *(undefined1 *)((anonymous_namespace)::ConvolveTestBase::input_ + uVar10) = 0xff;
      uVar7 = (ushort)this->mask_;
    }
    *(ushort *)((anonymous_namespace)::ConvolveTestBase::input16_ + uVar10 * 2) = uVar7;
  }
  return;
}

Assistant:

void SetUp() override {
    UUT_ = GET_PARAM(2);
    if (UUT_->use_highbd_ != 0)
      mask_ = (1 << UUT_->use_highbd_) - 1;
    else
      mask_ = 255;
    /* Set up guard blocks for an inner block centered in the outer block */
    for (int i = 0; i < kOutputBufferSize; ++i) {
      if (IsIndexInBorder(i)) {
        output_[i] = 255;
        output16_[i] = mask_;
      } else {
        output_[i] = 0;
        output16_[i] = 0;
      }
    }

    ::libaom_test::ACMRandom prng;
    for (int i = 0; i < kInputBufferSize; ++i) {
      if (i & 1) {
        input_[i] = 255;
        input16_[i] = mask_;
      } else {
        input_[i] = prng.Rand8Extremes();
        input16_[i] = prng.Rand16() & mask_;
      }
    }
  }